

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

Error asmjit::v1_14::Formatter::formatFuncArgs
                (String *sb,FormatFlags formatFlags,BaseCompiler *cc,FuncDetail *fd,
                ArgPack *argPacks)

{
  FuncDetail FVar1;
  Error EVar2;
  BaseBuilder *builder;
  long lVar3;
  undefined4 in_register_00000034;
  FormatOptions *formatOptions;
  String *sb_00;
  
  formatOptions = (FormatOptions *)CONCAT44(in_register_00000034,formatFlags);
  FVar1 = fd[0x74];
  if (FVar1 == (FuncDetail)0x0) {
    EVar2 = String::_opString(sb,kAppend,"void",0xffffffffffffffff);
    return EVar2;
  }
  lVar3 = 0;
  sb_00 = sb;
  do {
    if (lVar3 != 0) {
      formatOptions = (FormatOptions *)0x1;
      sb_00 = sb;
      EVar2 = String::_opString(sb,kAppend,", ",0xffffffffffffffff);
      if (EVar2 != 0) {
        return EVar2;
      }
    }
    if (lVar3 == 0x200) {
      formatFuncArgs();
      EVar2 = formatNodeList(sb_00,formatOptions,builder,*(BaseNode **)&builder->_nodeList,
                             (BaseNode *)0x0);
      return EVar2;
    }
    formatOptions = (FormatOptions *)(ulong)formatFlags;
    sb_00 = sb;
    EVar2 = formatFuncValuePack(sb,formatFlags,cc,(FuncValuePack *)(fd + lVar3 + 0x9c),
                                argPacks->_data);
    if (EVar2 != 0) {
      return EVar2;
    }
    lVar3 = lVar3 + 0x10;
    argPacks = (ArgPack *)((long)argPacks + 0x20);
  } while ((ulong)(byte)FVar1 * 0x10 != lVar3);
  return 0;
}

Assistant:

static Error formatFuncArgs(
  String& sb,
  FormatFlags formatFlags,
  const BaseCompiler* cc,
  const FuncDetail& fd,
  const FuncNode::ArgPack* argPacks) noexcept {

  uint32_t argCount = fd.argCount();
  if (!argCount)
    return sb.append("void");

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    if (argIndex)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatFuncValuePack(sb, formatFlags, cc, fd.argPack(argIndex), argPacks[argIndex]._data));
  }

  return kErrorOk;
}